

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

ValueType __thiscall
GlobOpt::GetPrepassValueTypeForDst
          (GlobOpt *this,ValueType desiredValueType,Instr *instr,Value *src1Value,Value *src2Value,
          bool isValueInfoPrecise,bool isSafeToTransferInPrepass)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2a [4];
  ValueType desiredValueType_local;
  
  local_2a[0] = desiredValueType.field_0;
  if (this->prePassLoop == (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x160c,"(IsLoopPrePass())","IsLoopPrePass()");
    if (!bVar2) goto LAB_0042f44b;
    *puVar3 = 0;
  }
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x160d,"(instr)","instr");
    if (!bVar2) {
LAB_0042f44b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (!isValueInfoPrecise) {
    bVar2 = ValueType::IsDefinite((ValueType *)&local_2a[0].field_0);
    if (bVar2) {
      bVar2 = ValueType::IsInt((ValueType *)&local_2a[0].field_0);
      if ((bVar2) && (bVar2 = OpCodeAttr::IsInt32(instr->m_opcode), bVar2)) {
        bVar2 = ValueType::IsLikelyTaggedInt((ValueType *)&local_2a[0].field_0);
        desiredValueType = ValueType::GetInt(bVar2);
      }
      else {
        bVar2 = ValueType::IsNumber((ValueType *)&local_2a[0].field_0);
        if ((bVar2) && (bVar2 = OpCodeAttr::ProducesNumber(instr->m_opcode), bVar2)) {
          desiredValueType = ValueType::ToDefiniteAnyNumber((ValueType *)&local_2a[0].field_0);
        }
        else {
          desiredValueType = ValueType::ToLikely((ValueType *)&local_2a[0].field_0);
        }
      }
    }
    else {
      desiredValueType.field_0 = local_2a[0];
      if (!isSafeToTransferInPrepass) {
        desiredValueType = ValueType::SetCanBeTaggedValue((ValueType *)&local_2a[0].field_0,true);
      }
    }
  }
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)desiredValueType;
}

Assistant:

ValueType
GlobOpt::GetPrepassValueTypeForDst(
    const ValueType desiredValueType,
    IR::Instr *const instr,
    Value *const src1Value,
    Value *const src2Value,
    bool const isValueInfoPrecise,
    bool const isSafeToTransferInPrepass) const
{
    // Values with definite types can be created in the loop prepass only when it is guaranteed that the value type will be the
    // same on any iteration of the loop. The heuristics currently used are:
    //     - If the source sym is not live on the back-edge, then it acquires a new value for each iteration of the loop, so
    //       that value type can be definite
    //         - Consider: A better solution for this is to track values that originate in this loop, which can have definite value
    //           types. That catches more cases, should look into that in the future.
    //     - If the source sym has a constant value that doesn't change for the duration of the function
    //     - The operation always results in a definite value type. For instance, signed bitwise operations always result in an
    //       int32, conv_num and ++ always result in a number, etc.
    //         - For operations that always result in an int32, the resulting int range is precise only if the source syms pass
    //           the above heuristics. Otherwise, the range must be expanded to the full int32 range.

    Assert(IsLoopPrePass());
    Assert(instr);

    if(!isValueInfoPrecise)
    {
        if(!desiredValueType.IsDefinite())
        {
            return isSafeToTransferInPrepass ? desiredValueType : desiredValueType.SetCanBeTaggedValue(true);
        }

        // If the desired value type is not precise, the value type of the destination is derived from the value types of the
        // sources. Since the value type of a source sym is not definite, the destination value type also cannot be definite.
        if(desiredValueType.IsInt() && OpCodeAttr::IsInt32(instr->m_opcode))
        {
            // The op always produces an int32, but not always a tagged int
            return ValueType::GetInt(desiredValueType.IsLikelyTaggedInt());
        }
        if(desiredValueType.IsNumber() && OpCodeAttr::ProducesNumber(instr->m_opcode))
        {
            // The op always produces a number, but not always an int
            return desiredValueType.ToDefiniteAnyNumber();
        }
        // Note: ToLikely() also sets CanBeTaggedValue
        return desiredValueType.ToLikely();
    }

    return desiredValueType;
}